

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall TPZVec<long>::Resize(TPZVec<long> *this,int64_t newsize,long *object)

{
  long *plVar1;
  long *plVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  
  if (-1 < newsize) {
    lVar5 = this->fNElements;
    if (lVar5 != newsize) {
      if (newsize == 0) {
        plVar2 = (long *)0x0;
      }
      else {
        plVar2 = (long *)operator_new__(-(ulong)((ulong)newsize >> 0x3d != 0) | newsize * 8);
      }
      if (newsize <= lVar5) {
        lVar5 = newsize;
      }
      plVar1 = this->fStore;
      lVar4 = 0;
      if (lVar5 < 1) {
        lVar5 = lVar4;
      }
      for (; lVar5 != lVar4; lVar4 = lVar4 + 1) {
        plVar2[lVar4] = plVar1[lVar4];
      }
      lVar4 = *object;
      for (; lVar5 < newsize; lVar5 = lVar5 + 1) {
        plVar2[lVar5] = lVar4;
      }
      if (plVar1 != (long *)0x0) {
        operator_delete__(plVar1);
      }
      this->fStore = plVar2;
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}